

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

void av1_restore_uv_color_map(AV1_COMP *cpi,MACROBLOCK *x)

{
  byte bVar1;
  PALETTE_BUFFER *pPVar2;
  uint8_t *color_map;
  uint16_t *puVar3;
  long lVar4;
  ulong uVar5;
  int16_t *piVar6;
  uint8_t *puVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ushort uVar13;
  uint8_t *puVar14;
  long lVar15;
  int16_t *piVar16;
  int cols;
  int rows;
  int local_a4;
  int plane_block_height;
  int plane_block_width;
  long local_98;
  long local_90;
  MB_MODE_INFO *local_88;
  uint8_t *local_80;
  long local_78;
  long local_70;
  long local_68;
  ulong local_60;
  int16_t centroids [16];
  
  local_88 = *(x->e_mbd).mi;
  local_98 = (long)x->plane[1].src.stride;
  puVar7 = x->plane[1].src.buf;
  pPVar2 = x->palette_buffer;
  piVar16 = pPVar2->kmeans_data_buf;
  puVar14 = x->plane[2].src.buf;
  local_80 = (x->e_mbd).plane[1].color_index_map;
  lVar15 = (long)puVar7 * 2;
  lVar8 = (long)puVar14 * 2;
  av1_get_block_dimensions
            (local_88->bsize,1,&x->e_mbd,&plane_block_width,&plane_block_height,&rows,&cols);
  color_map = local_80;
  local_90 = (long)cols;
  lVar9 = 0;
  uVar5 = 0;
  if (0 < cols) {
    uVar5 = (ulong)(uint)cols;
  }
  local_a4 = rows;
  local_60 = 0;
  if (0 < rows) {
    local_60 = (ulong)(uint)rows;
  }
  local_68 = local_90 * 2;
  local_70 = local_90 * 4;
  local_78 = local_98 * 2;
  piVar6 = piVar16;
  for (uVar10 = 0; uVar10 != local_60; uVar10 = uVar10 + 1) {
    lVar11 = lVar9;
    for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
      if (((cpi->common).seq_params)->use_highbitdepth == '\0') {
        lVar4 = (uVar10 * local_90 + uVar12) * 2;
        piVar6[uVar12 * 2] = (ushort)puVar7[uVar12];
        uVar13 = (ushort)puVar14[uVar12];
      }
      else {
        piVar6[uVar12 * 2] = *(int16_t *)(lVar15 + uVar12 * 2);
        uVar13 = *(ushort *)(lVar8 + uVar12 * 2);
        lVar4 = lVar11;
      }
      pPVar2->kmeans_data_buf[lVar4 + 1] = uVar13;
      lVar11 = lVar11 + 2;
    }
    lVar9 = lVar9 + local_68;
    piVar6 = piVar6 + local_90 * 2;
    lVar8 = lVar8 + local_78;
    lVar15 = lVar15 + local_78;
    puVar7 = puVar7 + local_98;
    puVar14 = puVar14 + local_98;
  }
  puVar3 = (local_88->palette_mode_info).palette_colors;
  piVar6 = centroids;
  for (lVar15 = 1; puVar3 = puVar3 + 8, lVar15 != 3; lVar15 = lVar15 + 1) {
    bVar1 = (local_88->palette_mode_info).palette_size[1];
    for (uVar5 = 0; uVar5 < bVar1; uVar5 = uVar5 + 1) {
      piVar6[uVar5 * 2] = puVar3[uVar5];
    }
    piVar6 = piVar6 + 1;
  }
  (*av1_calc_indices_dim2)
            (piVar16,centroids,local_80,(int64_t *)0x0,cols * rows,
             (int)(local_88->palette_mode_info).palette_size[1]);
  extend_palette_color_map(color_map,cols,rows,plane_block_width,plane_block_height);
  return;
}

Assistant:

void av1_restore_uv_color_map(const AV1_COMP *cpi, MACROBLOCK *x) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const BLOCK_SIZE bsize = mbmi->bsize;
  int src_stride = x->plane[1].src.stride;
  const uint8_t *const src_u = x->plane[1].src.buf;
  const uint8_t *const src_v = x->plane[2].src.buf;
  int16_t *const data = x->palette_buffer->kmeans_data_buf;
  int16_t centroids[2 * PALETTE_MAX_SIZE];
  uint8_t *const color_map = xd->plane[1].color_index_map;
  int r, c;
  const uint16_t *const src_u16 = CONVERT_TO_SHORTPTR(src_u);
  const uint16_t *const src_v16 = CONVERT_TO_SHORTPTR(src_v);
  int plane_block_width, plane_block_height, rows, cols;
  av1_get_block_dimensions(bsize, 1, xd, &plane_block_width,
                           &plane_block_height, &rows, &cols);

  for (r = 0; r < rows; ++r) {
    for (c = 0; c < cols; ++c) {
      if (cpi->common.seq_params->use_highbitdepth) {
        data[(r * cols + c) * 2] = src_u16[r * src_stride + c];
        data[(r * cols + c) * 2 + 1] = src_v16[r * src_stride + c];
      } else {
        data[(r * cols + c) * 2] = src_u[r * src_stride + c];
        data[(r * cols + c) * 2 + 1] = src_v[r * src_stride + c];
      }
    }
  }

  for (r = 1; r < 3; ++r) {
    for (c = 0; c < pmi->palette_size[1]; ++c) {
      centroids[c * 2 + r - 1] = pmi->palette_colors[r * PALETTE_MAX_SIZE + c];
    }
  }

  av1_calc_indices(data, centroids, color_map, rows * cols,
                   pmi->palette_size[1], 2);
  extend_palette_color_map(color_map, cols, rows, plane_block_width,
                           plane_block_height);
}